

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O0

void __thiscall OpenMD::Component::validate(Component *this)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  ParamConstraintFacade<OpenMD::NonNegativeConstraint> *this_00;
  undefined8 uVar4;
  long in_RDI;
  undefined8 in_R9;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe58;
  NotEmptyConstraint *in_stack_fffffffffffffe60;
  undefined1 *puVar5;
  undefined1 local_158 [32];
  string local_138 [32];
  NonNegativeConstraint local_118 [2];
  string local_d8 [32];
  PositiveConstraint local_b8 [2];
  string local_78 [48];
  string local_48 [72];
  
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x68));
  if (!bVar1) {
    isNotEmpty();
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData(in_stack_fffffffffffffe58);
    bVar1 = NotEmptyConstraint::operator()
                      (in_stack_fffffffffffffe60,(string *)in_stack_fffffffffffffe58);
    std::__cxx11::string::~string(local_48);
    NotEmptyConstraint::~NotEmptyConstraint((NotEmptyConstraint *)0x355aa1);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x68));
      uVar4 = std::__cxx11::string::c_str();
      isNotEmpty();
      ParamConstraintFacade<OpenMD::NotEmptyConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::NotEmptyConstraint> *)in_stack_fffffffffffffe58);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar4,uVar3);
      std::__cxx11::string::~string(local_78);
      NotEmptyConstraint::~NotEmptyConstraint((NotEmptyConstraint *)0x355b38);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0xb8));
  if (!bVar1) {
    isPositive();
    iVar2 = Parameter<int>::getData((Parameter<int> *)(in_RDI + 0xb8));
    bVar1 = PositiveConstraint::operator()(local_b8,iVar2);
    PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x355c3d);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0xb8));
      uVar4 = std::__cxx11::string::c_str();
      isPositive();
      ParamConstraintFacade<OpenMD::PositiveConstraint>::getConstraintDescription_abi_cxx11_
                ((ParamConstraintFacade<OpenMD::PositiveConstraint> *)in_stack_fffffffffffffe58);
      uVar3 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",uVar4,uVar3);
      std::__cxx11::string::~string(local_d8);
      PositiveConstraint::~PositiveConstraint((PositiveConstraint *)0x355cd7);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0xe8));
  if (!bVar1) {
    isNonNegative();
    iVar2 = Parameter<int>::getData((Parameter<int> *)(in_RDI + 0xe8));
    bVar1 = NonNegativeConstraint::operator()(local_118,iVar2);
    NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x355db9);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0xe8));
      this_00 = (ParamConstraintFacade<OpenMD::NonNegativeConstraint> *)
                std::__cxx11::string::c_str();
      puVar5 = local_158;
      isNonNegative();
      ParamConstraintFacade<OpenMD::NonNegativeConstraint>::getConstraintDescription_abi_cxx11_
                (this_00);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",this_00,uVar4,in_R9,
               this_00,puVar5);
      std::__cxx11::string::~string(local_138);
      NonNegativeConstraint::~NonNegativeConstraint((NonNegativeConstraint *)0x355e42);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void Component::validate() {
    CheckParameter(Type, isNotEmpty());
    CheckParameter(NMol, isPositive());
    CheckParameter(Region, isNonNegative());
  }